

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task.cpp
# Opt level: O1

void __thiscall Task::Task(Task *this,curl_off_t start,curl_off_t end,short status)

{
  long *local_68;
  undefined8 uStack_60;
  long local_58 [3];
  curl_off_t cStack_40;
  
  (this->proxy_server).address._M_dataplus._M_p = (pointer)&(this->proxy_server).address.field_2;
  (this->proxy_server).address._M_string_length = 0;
  (this->proxy_server).address.field_2._M_local_buf[0] = '\0';
  (this->proxy_server).speed = -1;
  (this->taskThread)._M_id._M_thread = 0;
  this->task_id = global_task_id;
  global_task_id = global_task_id + 1;
  local_58[1] = 0;
  local_58[2] = 0;
  uStack_60 = 0;
  local_58[0] = 0;
  cStack_40 = -1;
  local_68 = local_58;
  std::__cxx11::string::operator=((string *)&this->proxy_server,(string *)&local_68);
  *(long *)&(this->proxy_server).index = local_58[2];
  (this->proxy_server).speed = cStack_40;
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  this->start = start;
  this->end = end;
  this->download = 0;
  this->status = status;
  this->speed = 0;
  if ((this->taskThread)._M_id._M_thread == 0) {
    (this->taskThread)._M_id._M_thread = 0;
    return;
  }
  std::terminate();
}

Assistant:

Task::Task(curl_off_t start, curl_off_t end, short status) {
    this->task_id = global_task_id;
    global_task_id++;
    this->proxy_server = proxy();
    this->start = start;
    this->end = end;
    download = 0;
    this->status = status;
    speed = 0;
    this->taskThread = thread();
}